

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_ssse3.c
# Opt level: O0

void scale_plane_2_to_1_general
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,int16_t *coef,
               uint8_t *temp_buffer)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  int16_t *in_stack_00000008;
  __m128i f [4];
  __m128i d [4];
  __m128i s [11];
  uint8_t *t;
  int y;
  int x;
  int height_ver;
  int height_hor;
  int width_ver;
  int width_hor;
  __m128i *in_stack_fffffffffffffd58;
  __m128i *in_stack_fffffffffffffd60;
  __m128i *in_stack_fffffffffffffd68;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  longlong local_218;
  longlong lStack_210;
  longlong local_208;
  longlong lStack_200;
  longlong local_1f8;
  longlong lStack_1f0;
  longlong local_1e8 [2];
  longlong local_1d8;
  longlong lStack_1d0;
  longlong local_1c8;
  longlong lStack_1c0;
  longlong local_1b8;
  longlong lStack_1b0;
  longlong *local_168;
  uint local_15c;
  uint local_158;
  uint local_154;
  uint local_150;
  uint local_14c;
  uint local_148;
  int local_13c;
  long local_138;
  int local_12c;
  long local_128;
  longlong *local_120;
  longlong *local_118;
  longlong *local_110;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  short sStack_c0;
  short sStack_be;
  short sStack_bc;
  short sStack_ba;
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  short sStack_b0;
  short sStack_ae;
  short sStack_ac;
  short sStack_aa;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  short sStack_9a;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_148 = in_R8D + 3U & 0xfffffffc;
  local_14c = in_R8D + 7U & 0xfffffff8;
  local_15c = in_R9D * 2 + 0xdU & 0xfffffff8;
  local_154 = in_R9D + 3U & 0xfffffffc;
  local_168 = (longlong *)f[0][0];
  local_150 = local_15c;
  local_13c = in_ECX;
  local_138 = in_RDX;
  local_12c = in_ESI;
  local_128 = in_RDI;
  shuffle_filter_ssse3(in_stack_00000008,(__m128i *)&stack0xfffffffffffffd68);
  local_128 = local_128 - (local_12c * 3 + 5);
  do {
    load_8bit_8x8((uint8_t *)in_stack_fffffffffffffd60,(ptrdiff_t)in_stack_fffffffffffffd58,
                  (__m128i *)0x7b3d47);
    transpose_16bit_4x8(in_stack_fffffffffffffd58,(__m128i *)0x7b3d5c);
    local_158 = local_148;
    do {
      local_128 = local_128 + 8;
      in_stack_fffffffffffffd58 = &local_1e8;
      load_8bit_8x8((uint8_t *)in_stack_fffffffffffffd60,(ptrdiff_t)in_stack_fffffffffffffd58,
                    (__m128i *)0x7b3d9f);
      transpose_16bit_4x8(in_stack_fffffffffffffd58,(__m128i *)0x7b3dab);
      in_stack_fffffffffffffd60 = (__m128i *)&stack0xfffffffffffffd68;
      convolve8_8_ssse3((__m128i *)&local_218,in_stack_fffffffffffffd60);
      convolve8_8_ssse3((__m128i *)&local_208,in_stack_fffffffffffffd60);
      convolve8_8_ssse3((__m128i *)&local_1f8,in_stack_fffffffffffffd60);
      convolve8_8_ssse3(in_stack_fffffffffffffd58,in_stack_fffffffffffffd60);
      local_98 = (short)extraout_XMM0_Qa;
      sStack_96 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
      sStack_94 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
      sStack_92 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
      sStack_90 = (short)extraout_XMM0_Qb;
      sStack_8e = (short)((ulong)extraout_XMM0_Qb >> 0x10);
      sStack_8c = (short)((ulong)extraout_XMM0_Qb >> 0x20);
      sStack_8a = (short)((ulong)extraout_XMM0_Qb >> 0x30);
      local_a8 = (short)extraout_XMM0_Qa_01;
      sStack_a6 = (short)((ulong)extraout_XMM0_Qa_01 >> 0x10);
      sStack_a4 = (short)((ulong)extraout_XMM0_Qa_01 >> 0x20);
      sStack_a2 = (short)((ulong)extraout_XMM0_Qa_01 >> 0x30);
      sStack_a0 = (short)extraout_XMM0_Qb_01;
      sStack_9e = (short)((ulong)extraout_XMM0_Qb_01 >> 0x10);
      sStack_9c = (short)((ulong)extraout_XMM0_Qb_01 >> 0x20);
      sStack_9a = (short)((ulong)extraout_XMM0_Qb_01 >> 0x30);
      local_258._0_2_ =
           CONCAT11((0 < sStack_96) * (sStack_96 < 0x100) * (char)((ulong)extraout_XMM0_Qa >> 0x10)
                    - (0xff < sStack_96),
                    (0 < local_98) * (local_98 < 0x100) * (char)extraout_XMM0_Qa - (0xff < local_98)
                   );
      local_258._0_4_ =
           CONCAT13((0 < sStack_92) * (sStack_92 < 0x100) * (char)((ulong)extraout_XMM0_Qa >> 0x30)
                    - (0xff < sStack_92),
                    CONCAT12((0 < sStack_94) * (sStack_94 < 0x100) *
                             (char)((ulong)extraout_XMM0_Qa >> 0x20) - (0xff < sStack_94),
                             (undefined2)local_258));
      local_258._0_6_ =
           CONCAT15((0 < sStack_8e) * (sStack_8e < 0x100) * (char)((ulong)extraout_XMM0_Qb >> 0x10)
                    - (0xff < sStack_8e),
                    CONCAT14((0 < sStack_90) * (sStack_90 < 0x100) * (char)extraout_XMM0_Qb -
                             (0xff < sStack_90),(undefined4)local_258));
      local_258 = CONCAT17((0 < sStack_8a) * (sStack_8a < 0x100) *
                           (char)((ulong)extraout_XMM0_Qb >> 0x30) - (0xff < sStack_8a),
                           CONCAT16((0 < sStack_8c) * (sStack_8c < 0x100) *
                                    (char)((ulong)extraout_XMM0_Qb >> 0x20) - (0xff < sStack_8c),
                                    (undefined6)local_258));
      uStack_250._0_2_ =
           CONCAT11((0 < sStack_a6) * (sStack_a6 < 0x100) *
                    (char)((ulong)extraout_XMM0_Qa_01 >> 0x10) - (0xff < sStack_a6),
                    (0 < local_a8) * (local_a8 < 0x100) * (char)extraout_XMM0_Qa_01 -
                    (0xff < local_a8));
      uStack_250._0_4_ =
           CONCAT13((0 < sStack_a2) * (sStack_a2 < 0x100) *
                    (char)((ulong)extraout_XMM0_Qa_01 >> 0x30) - (0xff < sStack_a2),
                    CONCAT12((0 < sStack_a4) * (sStack_a4 < 0x100) *
                             (char)((ulong)extraout_XMM0_Qa_01 >> 0x20) - (0xff < sStack_a4),
                             (undefined2)uStack_250));
      uStack_250._0_6_ =
           CONCAT15((0 < sStack_9e) * (sStack_9e < 0x100) *
                    (char)((ulong)extraout_XMM0_Qb_01 >> 0x10) - (0xff < sStack_9e),
                    CONCAT14((0 < sStack_a0) * (sStack_a0 < 0x100) * (char)extraout_XMM0_Qb_01 -
                             (0xff < sStack_a0),(undefined4)uStack_250));
      uStack_250 = CONCAT17((0 < sStack_9a) * (sStack_9a < 0x100) *
                            (char)((ulong)extraout_XMM0_Qb_01 >> 0x30) - (0xff < sStack_9a),
                            CONCAT16((0 < sStack_9c) * (sStack_9c < 0x100) *
                                     (char)((ulong)extraout_XMM0_Qb_01 >> 0x20) - (0xff < sStack_9c)
                                     ,(undefined6)uStack_250));
      local_b8 = (short)extraout_XMM0_Qa_00;
      sStack_b6 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x10);
      sStack_b4 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x20);
      sStack_b2 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x30);
      sStack_b0 = (short)extraout_XMM0_Qb_00;
      sStack_ae = (short)((ulong)extraout_XMM0_Qb_00 >> 0x10);
      sStack_ac = (short)((ulong)extraout_XMM0_Qb_00 >> 0x20);
      sStack_aa = (short)((ulong)extraout_XMM0_Qb_00 >> 0x30);
      local_c8 = (short)extraout_XMM0_Qa_02;
      sStack_c6 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x10);
      sStack_c4 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x20);
      sStack_c2 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x30);
      sStack_c0 = (short)extraout_XMM0_Qb_02;
      sStack_be = (short)((ulong)extraout_XMM0_Qb_02 >> 0x10);
      sStack_bc = (short)((ulong)extraout_XMM0_Qb_02 >> 0x20);
      sStack_ba = (short)((ulong)extraout_XMM0_Qb_02 >> 0x30);
      local_248._0_2_ =
           CONCAT11((0 < sStack_b6) * (sStack_b6 < 0x100) *
                    (char)((ulong)extraout_XMM0_Qa_00 >> 0x10) - (0xff < sStack_b6),
                    (0 < local_b8) * (local_b8 < 0x100) * (char)extraout_XMM0_Qa_00 -
                    (0xff < local_b8));
      local_248._0_4_ =
           CONCAT13((0 < sStack_b2) * (sStack_b2 < 0x100) *
                    (char)((ulong)extraout_XMM0_Qa_00 >> 0x30) - (0xff < sStack_b2),
                    CONCAT12((0 < sStack_b4) * (sStack_b4 < 0x100) *
                             (char)((ulong)extraout_XMM0_Qa_00 >> 0x20) - (0xff < sStack_b4),
                             (undefined2)local_248));
      local_248._0_6_ =
           CONCAT15((0 < sStack_ae) * (sStack_ae < 0x100) *
                    (char)((ulong)extraout_XMM0_Qb_00 >> 0x10) - (0xff < sStack_ae),
                    CONCAT14((0 < sStack_b0) * (sStack_b0 < 0x100) * (char)extraout_XMM0_Qb_00 -
                             (0xff < sStack_b0),(undefined4)local_248));
      local_248 = CONCAT17((0 < sStack_aa) * (sStack_aa < 0x100) *
                           (char)((ulong)extraout_XMM0_Qb_00 >> 0x30) - (0xff < sStack_aa),
                           CONCAT16((0 < sStack_ac) * (sStack_ac < 0x100) *
                                    (char)((ulong)extraout_XMM0_Qb_00 >> 0x20) - (0xff < sStack_ac),
                                    (undefined6)local_248));
      uStack_240._0_2_ =
           CONCAT11((0 < sStack_c6) * (sStack_c6 < 0x100) *
                    (char)((ulong)extraout_XMM0_Qa_02 >> 0x10) - (0xff < sStack_c6),
                    (0 < local_c8) * (local_c8 < 0x100) * (char)extraout_XMM0_Qa_02 -
                    (0xff < local_c8));
      uStack_240._0_4_ =
           CONCAT13((0 < sStack_c2) * (sStack_c2 < 0x100) *
                    (char)((ulong)extraout_XMM0_Qa_02 >> 0x30) - (0xff < sStack_c2),
                    CONCAT12((0 < sStack_c4) * (sStack_c4 < 0x100) *
                             (char)((ulong)extraout_XMM0_Qa_02 >> 0x20) - (0xff < sStack_c4),
                             (undefined2)uStack_240));
      uStack_240._0_6_ =
           CONCAT15((0 < sStack_be) * (sStack_be < 0x100) *
                    (char)((ulong)extraout_XMM0_Qb_02 >> 0x10) - (0xff < sStack_be),
                    CONCAT14((0 < sStack_c0) * (sStack_c0 < 0x100) * (char)extraout_XMM0_Qb_02 -
                             (0xff < sStack_c0),(undefined4)uStack_240));
      uStack_240 = CONCAT17((0 < sStack_ba) * (sStack_ba < 0x100) *
                            (char)((ulong)extraout_XMM0_Qb_02 >> 0x30) - (0xff < sStack_ba),
                            CONCAT16((0 < sStack_bc) * (sStack_bc < 0x100) *
                                     (char)((ulong)extraout_XMM0_Qb_02 >> 0x20) - (0xff < sStack_bc)
                                     ,(undefined6)uStack_240));
      local_78 = local_258;
      uVar2 = local_78;
      uStack_70 = uStack_250;
      local_88 = local_248;
      uVar1 = local_88;
      uStack_80 = uStack_240;
      local_78._2_2_ = (undefined2)((uint)(undefined4)local_258 >> 0x10);
      local_78._4_2_ = (undefined2)((uint6)(undefined6)local_258 >> 0x20);
      local_78._6_2_ = (undefined2)((ulong)local_258 >> 0x30);
      local_88._2_2_ = (undefined2)((uint)(undefined4)local_248 >> 0x10);
      local_88._4_2_ = (undefined2)((uint6)(undefined6)local_248 >> 0x20);
      local_88._6_2_ = (undefined2)((ulong)local_248 >> 0x30);
      local_238 = CONCAT26(local_88._2_2_,
                           CONCAT24(local_78._2_2_,
                                    CONCAT22((undefined2)local_248,(undefined2)local_258)));
      uStack_230 = CONCAT26(local_88._6_2_,
                            CONCAT24(local_78._6_2_,CONCAT22(local_88._4_2_,local_78._4_2_)));
      local_58 = local_258;
      uStack_50 = uStack_250;
      uVar4 = uStack_50;
      local_68 = local_248;
      uStack_60 = uStack_240;
      uVar3 = uStack_60;
      uStack_50._2_2_ = (undefined2)((uint)(undefined4)uStack_250 >> 0x10);
      uStack_50._4_2_ = (undefined2)((uint6)(undefined6)uStack_250 >> 0x20);
      uStack_50._6_2_ = (undefined2)((ulong)uStack_250 >> 0x30);
      uStack_60._2_2_ = (undefined2)((uint)(undefined4)uStack_240 >> 0x10);
      uStack_60._4_2_ = (undefined2)((uint6)(undefined6)uStack_240 >> 0x20);
      uStack_60._6_2_ = (undefined2)((ulong)uStack_240 >> 0x30);
      local_228 = CONCAT26(uStack_60._2_2_,
                           CONCAT24(uStack_50._2_2_,
                                    CONCAT22((undefined2)uStack_240,(undefined2)uStack_250)));
      uStack_220 = CONCAT26(uStack_60._6_2_,
                            CONCAT24(uStack_50._6_2_,CONCAT22(uStack_60._4_2_,uStack_50._4_2_)));
      local_38 = local_238;
      uStack_30 = uStack_230;
      local_48 = local_228;
      uStack_40 = uStack_220;
      local_18 = local_238;
      uStack_10 = uStack_230;
      local_28 = local_228;
      uStack_20 = uStack_220;
      local_88 = uVar1;
      local_78 = uVar2;
      uStack_60 = uVar3;
      uStack_50 = uVar4;
      store_8bit_8x4_from_16x2
                (in_stack_fffffffffffffd68,(uint8_t *)in_stack_fffffffffffffd60,
                 (ptrdiff_t)in_stack_fffffffffffffd58);
      local_168 = (longlong *)((long)local_168 + 8);
      local_158 = local_158 - 4;
    } while (local_158 != 0);
    local_128 = local_128 + (int)(local_12c * 8 + local_148 * -2);
    local_168 = (longlong *)((long)local_168 + (long)(int)(local_148 * 6));
    local_15c = local_15c - 8;
    local_158 = 0;
  } while (local_15c != 0);
  local_158 = local_14c;
  local_168 = (longlong *)f[0][0];
  do {
    local_110 = local_168;
    local_218 = *local_168;
    lStack_210 = local_168[1];
    local_118 = (longlong *)((long)local_168 + (long)(int)(local_148 << 1));
    local_208 = *local_118;
    lStack_200 = local_118[1];
    local_120 = (longlong *)((long)local_168 + (long)(int)(local_148 << 2));
    local_1f8 = *local_120;
    lStack_1f0 = local_120[1];
    local_168 = (longlong *)((long)local_168 + (long)(int)(local_148 * 6));
    local_15c = local_154;
    do {
      loadu_8bit_16x4((uint8_t *)local_168,(long)(int)(local_148 << 1),&local_1e8);
      local_168 = (longlong *)((long)local_168 + (long)(int)(local_148 << 3));
      convolve8_8_ssse3((__m128i *)&local_218,(__m128i *)&stack0xfffffffffffffd68);
      convolve8_8_ssse3((__m128i *)&local_208,(__m128i *)&stack0xfffffffffffffd68);
      convolve8_8_ssse3((__m128i *)&local_1f8,(__m128i *)&stack0xfffffffffffffd68);
      convolve8_8_ssse3(&local_1e8,(__m128i *)&stack0xfffffffffffffd68);
      store_8bit_8x4_from_16x2
                (in_stack_fffffffffffffd68,(uint8_t *)in_stack_fffffffffffffd60,
                 (ptrdiff_t)in_stack_fffffffffffffd58);
      local_218 = local_1d8;
      lStack_210 = lStack_1d0;
      local_208 = local_1c8;
      lStack_200 = lStack_1c0;
      local_1f8 = local_1b8;
      lStack_1f0 = lStack_1b0;
      local_138 = local_138 + (local_13c << 2);
      local_15c = local_15c - 4;
    } while (local_15c != 0);
    local_168 = (longlong *)
                ((long)local_168 + (0x10 - (long)(int)(local_148 * (local_154 * 2 + 6))));
    local_138 = (local_138 - (int)(local_154 * local_13c)) + 8;
    local_158 = local_158 - 8;
  } while (local_158 != 0);
  return;
}

Assistant:

static void scale_plane_2_to_1_general(const uint8_t *src, const int src_stride,
                                       uint8_t *dst, const int dst_stride,
                                       const int w, const int h,
                                       const int16_t *const coef,
                                       uint8_t *const temp_buffer) {
  const int width_hor = (w + 3) & ~3;
  const int width_ver = (w + 7) & ~7;
  const int height_hor = (2 * h + SUBPEL_TAPS - 2 + 7) & ~7;
  const int height_ver = (h + 3) & ~3;
  int x, y = height_hor;
  uint8_t *t = temp_buffer;
  __m128i s[11], d[4];
  __m128i f[4];

  assert(w && h);

  shuffle_filter_ssse3(coef, f);
  src -= (SUBPEL_TAPS / 2 - 1) * src_stride + SUBPEL_TAPS / 2 + 1;

  // horizontal 4x8
  do {
    load_8bit_8x8(src + 2, src_stride, s);
    // 00 01 10 11 20 21 30 31  40 41 50 51 60 61 70 71
    // 02 03 12 13 22 23 32 33  42 43 52 53 62 63 72 73
    // 04 05 14 15 24 25 34 35  44 45 54 55 64 65 74 75
    // 06 07 16 17 26 27 36 37  46 47 56 57 66 67 76 77 (overlapped)
    transpose_16bit_4x8(s, s);
    x = width_hor;

    do {
      src += 8;
      load_8bit_8x8(src, src_stride, &s[3]);
      // 06 07 16 17 26 27 36 37  46 47 56 57 66 67 76 77
      // 08 09 18 19 28 29 38 39  48 49 58 59 68 69 78 79
      // 0A 0B 1A 1B 2A 2B 3A 3B  4A 4B 5A 5B 6A 6B 7A 7B
      // 0C 0D 1C 1D 2C 2D 3C 3D  4C 4D 5C 5D 6C 6D 7C 7D
      transpose_16bit_4x8(&s[3], &s[3]);

      d[0] = convolve8_8_ssse3(&s[0], f);  // 00 10 20 30 40 50 60 70
      d[1] = convolve8_8_ssse3(&s[1], f);  // 01 11 21 31 41 51 61 71
      d[2] = convolve8_8_ssse3(&s[2], f);  // 02 12 22 32 42 52 62 72
      d[3] = convolve8_8_ssse3(&s[3], f);  // 03 13 23 33 43 53 63 73

      // 00 10 20 30 40 50 60 70  02 12 22 32 42 52 62 72
      // 01 11 21 31 41 51 61 71  03 13 23 33 43 53 63 73
      d[0] = _mm_packus_epi16(d[0], d[2]);
      d[1] = _mm_packus_epi16(d[1], d[3]);
      // 00 10 01 11 20 30 21 31  40 50 41 51 60 70 61 71
      // 02 12 03 13 22 32 23 33  42 52 43 53 62 72 63 73
      d[2] = _mm_unpacklo_epi16(d[0], d[1]);
      d[3] = _mm_unpackhi_epi16(d[0], d[1]);
      // 00 10 01 11 02 12 03 13  20 30 21 31 22 32 23 33
      // 40 50 41 51 42 52 43 53  60 70 61 71 62 72 63 73
      d[0] = _mm_unpacklo_epi32(d[2], d[3]);
      d[1] = _mm_unpackhi_epi32(d[2], d[3]);
      store_8bit_8x4_from_16x2(d, t, 2 * width_hor);

      s[0] = s[4];
      s[1] = s[5];
      s[2] = s[6];

      t += 8;
      x -= 4;
    } while (x);
    src += 8 * src_stride - 2 * width_hor;
    t += 6 * width_hor;
    y -= 8;
  } while (y);

  // vertical 8x4
  x = width_ver;
  t = temp_buffer;
  do {
    // 00 10 01 11 02 12 03 13  04 14 05 15 06 16 07 17
    // 20 30 21 31 22 32 23 33  24 34 25 35 26 36 27 37
    // 40 50 41 51 42 52 43 53  44 54 45 55 46 56 47 57
    s[0] = _mm_loadu_si128((const __m128i *)(t + 0 * width_hor));
    s[1] = _mm_loadu_si128((const __m128i *)(t + 2 * width_hor));
    s[2] = _mm_loadu_si128((const __m128i *)(t + 4 * width_hor));
    t += 6 * width_hor;
    y = height_ver;

    do {
      // 60 70 61 71 62 72 63 73  64 74 65 75 66 76 67 77
      // 80 90 81 91 82 92 83 93  84 94 85 95 86 96 87 77
      // A0 B0 A1 B1 A2 B2 A3 B3  A4 B4 A5 B5 A6 B6 A7 77
      // C0 D0 C1 D1 C2 D2 C3 D3  C4 D4 C5 D5 C6 D6 C7 77
      loadu_8bit_16x4(t, 2 * width_hor, &s[3]);
      t += 8 * width_hor;

      d[0] = convolve8_8_ssse3(&s[0], f);  // 00 01 02 03 04 05 06 07
      d[1] = convolve8_8_ssse3(&s[1], f);  // 10 11 12 13 14 15 16 17
      d[2] = convolve8_8_ssse3(&s[2], f);  // 20 21 22 23 24 25 26 27
      d[3] = convolve8_8_ssse3(&s[3], f);  // 30 31 32 33 34 35 36 37

      // 00 01 02 03 04 05 06 07  10 11 12 13 14 15 16 17
      // 20 21 22 23 24 25 26 27  30 31 32 33 34 35 36 37
      d[0] = _mm_packus_epi16(d[0], d[1]);
      d[1] = _mm_packus_epi16(d[2], d[3]);
      store_8bit_8x4_from_16x2(d, dst, dst_stride);

      s[0] = s[4];
      s[1] = s[5];
      s[2] = s[6];

      dst += 4 * dst_stride;
      y -= 4;
    } while (y);
    t -= width_hor * (2 * height_ver + 6);
    t += 16;
    dst -= height_ver * dst_stride;
    dst += 8;
    x -= 8;
  } while (x);
}